

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O0

void __thiscall
features::Sift::add_octave(Sift *this,ConstPtr *image,float has_sigma,float target_sigma)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  double dVar1;
  double dVar2;
  reference this_01;
  shared_ptr<const_core::Image<float>_> local_130;
  shared_ptr<const_core::Image<float>_> local_120;
  undefined1 local_110 [8];
  Ptr dog;
  undefined1 local_f0 [8];
  Ptr img;
  float blur_sigma;
  float sigmak;
  int i;
  float k;
  Octave *oct;
  pointer psStack_c0;
  pointer local_b8;
  pointer psStack_b0;
  pointer local_a8;
  pointer psStack_a0;
  pointer local_98;
  pointer psStack_90;
  pointer local_88;
  pointer psStack_80;
  pointer local_78;
  pointer psStack_70;
  byte local_49;
  shared_ptr<const_core::Image<float>_> local_48;
  undefined1 local_38 [8];
  Ptr base;
  float sigma;
  float target_sigma_local;
  float has_sigma_local;
  ConstPtr *image_local;
  Sift *this_local;
  
  dVar1 = std::sqrt((double)(ulong)(uint)(target_sigma * target_sigma + -(has_sigma * has_sigma)));
  base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       SUB84(dVar1,0);
  local_49 = 0;
  if (target_sigma <= has_sigma) {
    std::__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)image);
    core::Image<float>::duplicate((Image<float> *)local_38);
  }
  else {
    std::shared_ptr<const_core::Image<float>_>::shared_ptr(&local_48,image);
    local_49 = 1;
    core::image::blur_gaussian<float>
              ((image *)local_38,&local_48,
               base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._4_4_);
  }
  if ((local_49 & 1) != 0) {
    std::shared_ptr<const_core::Image<float>_>::~shared_ptr(&local_48);
  }
  local_78 = (pointer)0x0;
  psStack_70 = (pointer)0x0;
  local_88 = (pointer)0x0;
  psStack_80 = (pointer)0x0;
  local_98 = (pointer)0x0;
  psStack_90 = (pointer)0x0;
  local_a8 = (pointer)0x0;
  psStack_a0 = (pointer)0x0;
  local_b8 = (pointer)0x0;
  psStack_b0 = (pointer)0x0;
  oct = (Octave *)0x0;
  psStack_c0 = (pointer)0x0;
  Octave::Octave((Octave *)&oct);
  std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::push_back
            (&this->octaves,(Octave *)&oct);
  Octave::~Octave((Octave *)&oct);
  this_01 = std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::back
                      (&this->octaves);
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::push_back(&this_01->img,(value_type *)local_38);
  dVar1 = std::pow(5.30498947741318e-315,
                   (double)(ulong)(uint)(1.0 / (float)(this->options).num_samples_per_octave));
  base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       target_sigma;
  for (blur_sigma = 1.4013e-45; (int)blur_sigma < (this->options).num_samples_per_octave + 3;
      blur_sigma = (float)((int)blur_sigma + 1)) {
    img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
         _4_4_ * SUB84(dVar1,0);
    dVar2 = std::sqrt((double)(ulong)(uint)(img.
                                            super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi._4_4_ *
                                            img.
                                            super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi._4_4_ -
                                           base.
                                           super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi._4_4_ *
                                           base.
                                           super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi._4_4_));
    img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         SUB84(dVar2,0);
    this_00 = &dog.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>
              ((shared_ptr<core::Image<float>const> *)this_00,
               (shared_ptr<core::Image<float>_> *)local_38);
    core::image::blur_gaussian<float>
              ((image *)local_f0,(ConstPtr *)this_00,
               img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._0_4_);
    std::shared_ptr<const_core::Image<float>_>::~shared_ptr
              ((shared_ptr<const_core::Image<float>_> *)
               &dog.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::
    vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
    ::push_back(&this_01->img,(value_type *)local_f0);
    std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>
              ((shared_ptr<core::Image<float>const> *)&local_120,
               (shared_ptr<core::Image<float>_> *)local_f0);
    std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>
              ((shared_ptr<core::Image<float>const> *)&local_130,
               (shared_ptr<core::Image<float>_> *)local_38);
    core::image::subtract<float>((image *)local_110,(ConstPtr *)&local_120,(ConstPtr *)&local_130);
    std::shared_ptr<const_core::Image<float>_>::~shared_ptr(&local_130);
    std::shared_ptr<const_core::Image<float>_>::~shared_ptr(&local_120);
    std::
    vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
    ::push_back(&this_01->dog,(value_type *)local_110);
    std::shared_ptr<core::Image<float>_>::operator=
              ((shared_ptr<core::Image<float>_> *)local_38,
               (shared_ptr<core::Image<float>_> *)local_f0);
    base.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
         = img.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
           _4_4_;
    std::shared_ptr<core::Image<float>_>::~shared_ptr((shared_ptr<core::Image<float>_> *)local_110);
    std::shared_ptr<core::Image<float>_>::~shared_ptr((shared_ptr<core::Image<float>_> *)local_f0);
  }
  std::shared_ptr<core::Image<float>_>::~shared_ptr((shared_ptr<core::Image<float>_> *)local_38);
  return;
}

Assistant:

void
Sift::add_octave (core::FloatImage::ConstPtr image,
        float has_sigma, float target_sigma)
{
    /*
     * First, bring the provided image to the target blur.
     * Since L * g(sigma1) * g(sigma2) = L * g(sqrt(sigma1^2 + sigma2^2)),
     * we need to blur with sigma = sqrt(target_sigma^2 - has_sigma^2).
     */
    float sigma = std::sqrt(MATH_POW2(target_sigma) - MATH_POW2(has_sigma));
    //std::cout << "Pre-blurring image to sigma " << target_sigma << " (has "
    //    << has_sigma << ", blur = " << sigma << ")..." << std::endl;
    core::FloatImage::Ptr base = (target_sigma > has_sigma
        ? core::image::blur_gaussian<float>(image, sigma)
        : image->duplicate());

    /* Create the new octave and add initial image. */
    this->octaves.push_back(Octave());
    Octave& oct = this->octaves.back();
    oct.img.push_back(base);

    /* 'k' is the constant factor between the scales in scale space. */
    float const k = std::pow(2.0f, 1.0f / this->options.num_samples_per_octave);
    sigma = target_sigma;

    /* Create other (s+2) samples of the octave to get a total of (s+3). */
    for (int i = 1; i < this->options.num_samples_per_octave + 3; ++i)
    {
        /* Calculate the blur sigma the image will get. */
        float sigmak = sigma * k;
        float blur_sigma = std::sqrt(MATH_POW2(sigmak) - MATH_POW2(sigma));

        /* Blur the image to create a new scale space sample. */
        //std::cout << "Blurring image to sigma " << sigmak << " (has " << sigma
        //    << ", blur = " << blur_sigma << ")..." << std::endl;
        core::FloatImage::Ptr img = core::image::blur_gaussian<float>
            (base, blur_sigma);
        oct.img.push_back(img);

        /* Create the Difference of Gaussian image (DoG). */
        //计算差分拉普拉斯 // todo revised by sway
        core::FloatImage::Ptr dog = core::image::subtract<float>(img, base);
        oct.dog.push_back(dog);

        /* Update previous image and sigma for next round. */
        base = img;
        sigma = sigmak;
    }
}